

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicState4::Run(BasicState4 *this)

{
  GLuint divisor;
  int iVar1;
  CallLogWrapper *this_00;
  GLuint GVar2;
  byte bVar3;
  bool bVar4;
  VertexAttribState va2;
  VertexAttribState va5;
  VertexBindingState vb2;
  VertexBindingState vb5;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  GVar2 = 0;
  bVar3 = 1;
  iVar1 = 0x10;
  while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
    VertexAttribState::VertexAttribState(&va5,GVar2);
    VertexBindingState::VertexBindingState((VertexBindingState *)&va2,GVar2);
    divisor = GVar2 + 7;
    glu::CallLogWrapper::glVertexAttribDivisor(this_00,GVar2,divisor);
    va2.array_integer = divisor;
    va5.array_divisor = divisor;
    bVar4 = VertexAttribState::stateVerify(&va5);
    if (bVar4) {
      bVar4 = VertexBindingState::stateVerify((VertexBindingState *)&va2);
      if (!bVar4) goto LAB_00a83d68;
    }
    else {
LAB_00a83d68:
      bVar3 = 0;
      anon_unknown_0::Output("glVertexAttribDivisor state change check failed.\n");
    }
    glu::CallLogWrapper::~CallLogWrapper(&va2.super_GLWrapper.super_CallLogWrapper);
    glu::CallLogWrapper::~CallLogWrapper(&va5.super_GLWrapper.super_CallLogWrapper);
    GVar2 = GVar2 + 1;
  }
  for (GVar2 = 0; GVar2 != 0x10; GVar2 = GVar2 + 1) {
    VertexAttribState::VertexAttribState(&va5,GVar2);
    VertexBindingState::VertexBindingState((VertexBindingState *)&va2,GVar2);
    glu::CallLogWrapper::glVertexBindingDivisor(this_00,GVar2,GVar2);
    va2.array_integer = GVar2;
    va5.array_divisor = GVar2;
    bVar4 = VertexAttribState::stateVerify(&va5);
    if (bVar4) {
      bVar4 = VertexBindingState::stateVerify((VertexBindingState *)&va2);
      if (!bVar4) goto LAB_00a83def;
    }
    else {
LAB_00a83def:
      bVar3 = 0;
      anon_unknown_0::Output("glVertexBindingDivisor state change check failed.\n");
    }
    glu::CallLogWrapper::~CallLogWrapper(&va2.super_GLWrapper.super_CallLogWrapper);
    glu::CallLogWrapper::~CallLogWrapper(&va5.super_GLWrapper.super_CallLogWrapper);
  }
  glu::CallLogWrapper::glVertexAttribBinding(this_00,2,5);
  VertexAttribState::VertexAttribState(&va5,5);
  va5.array_divisor = 5;
  VertexBindingState::VertexBindingState(&vb5,5);
  vb5.divisor = 5;
  VertexAttribState::VertexAttribState(&va2,2);
  va2.array_divisor = 5;
  VertexBindingState::VertexBindingState(&vb2,2);
  vb2.divisor = 2;
  va2.binding = 5;
  bVar4 = VertexAttribState::stateVerify(&va5);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&vb5);
    if (!bVar4) goto LAB_00a83ecd;
    bVar4 = VertexAttribState::stateVerify(&va2);
    if (!bVar4) goto LAB_00a83ecd;
    bVar4 = VertexBindingState::stateVerify(&vb2);
    if (!bVar4) goto LAB_00a83ecd;
  }
  else {
LAB_00a83ecd:
    bVar3 = 0;
    anon_unknown_0::Output("glVertexAttribBinding state change check failed.\n");
  }
  glu::CallLogWrapper::glVertexAttribDivisor(this_00,2,0x17);
  va2.binding = 2;
  va2.array_divisor = 0x17;
  vb2.divisor = 0x17;
  bVar4 = VertexAttribState::stateVerify(&va5);
  if (bVar4) {
    bVar4 = VertexBindingState::stateVerify(&vb5);
    if (bVar4) {
      bVar4 = VertexAttribState::stateVerify(&va2);
      if (bVar4) {
        bVar4 = VertexBindingState::stateVerify(&vb2);
        if (bVar4) goto LAB_00a83f50;
      }
    }
  }
  bVar3 = 0;
  anon_unknown_0::Output("glVertexAttribDivisor state change check failed.\n");
LAB_00a83f50:
  glu::CallLogWrapper::~CallLogWrapper(&vb2.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&va2.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&vb5.super_GLWrapper.super_CallLogWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&va5.super_GLWrapper.super_CallLogWrapper);
  return -(ulong)(~bVar3 & 1);
}

Assistant:

virtual long Run()
	{
		bool status = true;
		glBindVertexArray(m_vao);

		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState  va(i);
			VertexBindingState vb(i);
			glVertexAttribDivisor(i, i + 7);
			va.array_divisor = i + 7;
			vb.divisor		 = i + 7;
			if (!va.stateVerify() || !vb.stateVerify())
			{
				Output("glVertexAttribDivisor state change check failed.\n");
				status = false;
			}
		}
		for (GLuint i = 0; i < 16; ++i)
		{
			VertexAttribState  va(i);
			VertexBindingState vb(i);
			glVertexBindingDivisor(i, i);
			va.array_divisor = i;
			vb.divisor		 = i;
			if (!va.stateVerify() || !vb.stateVerify())
			{
				Output("glVertexBindingDivisor state change check failed.\n");
				status = false;
			}
		}

		glVertexAttribBinding(2, 5);
		VertexAttribState va5(5);
		va5.array_divisor = 5;
		VertexBindingState vb5(5);
		vb5.divisor = 5;
		VertexAttribState va2(2);
		va2.array_divisor = 5;
		VertexBindingState vb2(2);
		vb2.divisor = 2;
		va2.binding = 5;
		if (!va5.stateVerify() || !vb5.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribBinding state change check failed.\n");
			status = false;
		}

		glVertexAttribDivisor(2, 23);
		va2.binding		  = 2;
		va2.array_divisor = 23;
		vb2.divisor		  = 23;
		if (!va5.stateVerify() || !vb5.stateVerify() || !va2.stateVerify() || !vb2.stateVerify())
		{
			Output("glVertexAttribDivisor state change check failed.\n");
			status = false;
		}

		if (status)
			return NO_ERROR;
		else
			return ERROR;
	}